

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<unsigned_int> * __thiscall
VW::config::typed_option<unsigned_int>::value(typed_option<unsigned_int> *this,uint value)

{
  typed_option<unsigned_int> *in_RDI;
  uint *in_stack_00000008;
  shared_ptr<unsigned_int> *in_stack_ffffffffffffffe0;
  
  std::make_shared<unsigned_int,unsigned_int&>(in_stack_00000008);
  std::shared_ptr<unsigned_int>::operator=
            (in_stack_ffffffffffffffe0,(shared_ptr<unsigned_int> *)in_RDI);
  std::shared_ptr<unsigned_int>::~shared_ptr((shared_ptr<unsigned_int> *)0x141024);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }